

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O3

char * coda_identifier_from_name(char *name,hashtable *hash_data)

{
  ushort *puVar1;
  ushort **ppuVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  char cVar6;
  uint uVar7;
  long lVar8;
  char *pcVar9;
  char *__s;
  
  pcVar9 = "unnamed";
  __s = pcVar9;
  if ((name != (char *)0x0) && (cVar6 = *name, cVar6 != '\0')) {
    ppuVar2 = __ctype_b_loc();
    do {
      __s = name;
      if ((*(byte *)((long)*ppuVar2 + (long)cVar6 * 2 + 1) & 4) != 0) break;
      cVar6 = name[1];
      name = name + 1;
      __s = pcVar9;
    } while (cVar6 != '\0');
  }
  sVar3 = strlen(__s);
  lVar8 = sVar3 << 0x20;
  pcVar9 = (char *)malloc(lVar8 + 0x500000000 >> 0x20);
  if (pcVar9 == (char *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                   lVar8 + 0x400000000 >> 0x20,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                   ,0xac);
  }
  else {
    *pcVar9 = *__s;
    if (1 < (int)(uint)sVar3) {
      ppuVar2 = __ctype_b_loc();
      puVar1 = *ppuVar2;
      uVar5 = 1;
      do {
        cVar6 = '_';
        if ((puVar1[__s[uVar5]] & 8) != 0) {
          cVar6 = __s[uVar5];
        }
        pcVar9[uVar5] = cVar6;
        uVar5 = uVar5 + 1;
      } while (((uint)sVar3 & 0x7fffffff) != uVar5);
    }
    pcVar9[lVar8 >> 0x20] = '\0';
    if ((hash_data != (hashtable *)0x0) &&
       (lVar4 = coda_hashtable_get_index_from_name(hash_data,pcVar9), -1 < lVar4)) {
      uVar7 = 1;
      do {
        if (uVar7 == 1000) {
          __assert_fail("counter < 1000",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                        ,0xcb,"char *coda_identifier_from_name(const char *, hashtable *)");
        }
        sprintf(pcVar9 + (lVar8 >> 0x20),"_%d",(ulong)uVar7);
        lVar4 = coda_hashtable_get_index_from_name(hash_data,pcVar9);
        uVar7 = uVar7 + 1;
      } while (-1 < lVar4);
    }
  }
  return pcVar9;
}

Assistant:

char *coda_identifier_from_name(const char *name, hashtable *hash_data)
{
    const int postfix_length = 4;
    char *identifier;
    int length;
    int i;

    if (name == NULL)
    {
        name = "unnamed";
    }
    else
    {
        /* strip leading non-alpha characters */
        while (*name != '\0' && !isalpha(*name))
        {
            name++;
        }
        if (*name == '\0')
        {
            name = "unnamed";
        }
    }

    length = (int)strlen(name);
    /* allow some space for _### postfixes */
    identifier = malloc(length + postfix_length + 1);
    if (identifier == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)(length + postfix_length), __FILE__, __LINE__);
        return NULL;
    }

    /* create identifier */

    /* first character is guaranteed to be an alpha character because of our previous test */
    identifier[0] = name[0];
    /* replace non-alphanumeric characters by a '_' */
    for (i = 1; i < length; i++)
    {
        if (isalnum(name[i]))
        {
            identifier[i] = name[i];
        }
        else
        {
            identifier[i] = '_';
        }
    }
    identifier[length] = '\0';

    /* check for double occurrences */
    if (hash_data != NULL)
    {
        int counter;

        counter = 0;
        while (hashtable_get_index_from_name(hash_data, identifier) >= 0)
        {
            counter++;
            assert(counter < 1000);
            sprintf(&identifier[length], "_%d", counter);
        }
    }

    return identifier;
}